

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O3

void __thiscall
lf::assemble::test::BoundaryAssembler::BoundaryAssembler
          (BoundaryAssembler *this,shared_ptr<lf::mesh::Mesh> *mesh_p)

{
  shared_ptr<const_lf::mesh::Mesh> local_20;
  
  (this->mesh_p_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->mesh_p_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mesh_p_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  (mesh_p->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->mesh_p_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  lf::mesh::utils::CountNumSuperEntities(&this->cells_at_edges_,&local_20,1,1);
  if (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

BoundaryAssembler::BoundaryAssembler(std::shared_ptr<lf::mesh::Mesh> mesh_p)
    : mesh_p_(std::move(mesh_p)),
      cells_at_edges_(lf::mesh::utils::CountNumSuperEntities(mesh_p_, 1, 1)) {}